

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Asset.h
# Opt level: O0

void __thiscall glTF2::Buffer::SEncodedRegion::~SEncodedRegion(SEncodedRegion *this)

{
  SEncodedRegion *this_local;
  
  if (*(void **)(this + 0x10) != (void *)0x0) {
    operator_delete__(*(void **)(this + 0x10));
  }
  std::__cxx11::string::~string((string *)(this + 0x20));
  return;
}

Assistant:

~SEncodedRegion() { delete[] DecodedData; }